

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_bitwiseXor_ivec2(ShaderEvalContext *c)

{
  undefined8 uVar1;
  
  uVar1 = *(undefined8 *)(c->in[0].m_data + 3);
  *(ulong *)((c->color).m_data + 1) =
       CONCAT44((float)((int)(float)((ulong)uVar1 >> 0x20) ^ (int)c->in[0].m_data[1]),
                (float)((int)(float)uVar1 ^ (int)c->in[1].m_data[1]));
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }